

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgamma.c
# Opt level: O2

int main(int argc,char **argv)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int extraout_EAX;
  long lVar5;
  undefined8 uVar6;
  long lVar7;
  uint uVar8;
  FILE *pFVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float local_444;
  Uint32 flags;
  int bpp;
  int h;
  int w;
  double local_430;
  Uint16 ramp [256];
  Uint16 red_ramp [256];
  
  iVar3 = get_video_args(argv,&w,&h,&bpp,&flags);
  iVar4 = SDL_Init(0x20);
  pFVar9 = _stderr;
  if (iVar4 < 0) {
    uVar6 = SDL_GetError();
    fprintf(pFVar9,"Couldn\'t initialize SDL: %s\n",uVar6);
    return 1;
  }
  lVar5 = SDL_SetVideoMode(w,h,bpp,flags | 0x20000000);
  pFVar9 = _stderr;
  if (lVar5 == 0) {
    uVar6 = SDL_GetError();
    fprintf(pFVar9,"Couldn\'t set %dx%d video mode: %s\n",(ulong)(uint)w,(ulong)(uint)h,uVar6);
    quit((int)pFVar9);
  }
  else {
    SDL_WM_SetCaption("SDL gamma test","testgamma");
    if (argv[iVar3] == (char *)0x0) {
      local_444 = 1.0;
    }
    else {
      dVar10 = atof(argv[iVar3]);
      local_444 = (float)dVar10;
    }
    iVar3 = SDL_SetGamma();
    if (-1 < iVar3) {
      uVar6 = SDL_RWFromFile("sample.bmp","rb");
      lVar7 = __libc_start_main(uVar6,1);
      if (lVar7 != 0) {
        uVar1 = *(ulong *)(lVar7 + 0x10);
        auVar12._8_8_ = 0;
        auVar12._0_8_ = uVar1;
        auVar11._0_4_ = (int)*(undefined8 *)(lVar5 + 0x10) - (int)uVar1;
        auVar11._4_4_ = (int)((ulong)*(undefined8 *)(lVar5 + 0x10) >> 0x20) - (int)(uVar1 >> 0x20);
        auVar11._8_8_ = 0;
        auVar13._0_4_ = (uint)(auVar11._0_4_ - (auVar11._0_4_ >> 0x1f)) >> 1;
        auVar13._4_4_ = (uint)(auVar11._4_4_ - (auVar11._4_4_ >> 0x1f)) >> 1;
        auVar13._8_8_ = 0;
        auVar11 = pshuflw(auVar11,auVar13,0xe8);
        ramp._0_4_ = auVar11._0_4_;
        auVar11 = pshuflw(auVar11,auVar12,0xe8);
        ramp._4_4_ = auVar11._0_4_;
        SDL_UpperBlit(lVar7,0,lVar5,ramp);
        SDL_UpdateRects(lVar5,1,ramp);
      }
      uVar8 = 5000;
      iVar3 = SDL_GetTicks();
      do {
        iVar4 = SDL_GetTicks();
        uVar2 = uVar8;
        if (uVar8 <= (uint)(iVar4 - iVar3)) {
          while (local_444 < 10.0) {
            local_444 = local_444 + 0.1;
            local_430 = (double)local_444;
            CalculateGamma(local_430,red_ramp);
            CalculateGamma(1.0 / local_430,ramp);
            SDL_SetGammaRamp(red_ramp,ramp,ramp);
          }
          memset(red_ramp,0xff,0x200);
          memset(ramp,0,0x200);
          SDL_SetGammaRamp(red_ramp,ramp,ramp);
          for (uVar8 = (uint)red_ramp[0]._1_1_; -1 < (int)uVar8; uVar8 = uVar8 - 1) {
            memset(red_ramp,uVar8,0x200);
            SDL_SetGammaRamp(red_ramp,0,0);
          }
          SDL_Delay(1000);
          SDL_Quit();
          return 0;
        }
LAB_00101589:
        uVar8 = uVar2;
        iVar4 = SDL_PollEvent(ramp);
      } while (iVar4 == 0);
      if ((ramp._0_4_ & 0xff) == 2) {
        uVar2 = 0;
        if (ramp._8_4_ != 0x1b) {
          if (ramp._8_4_ == 0x112) {
            local_444 = local_444 + -0.2;
          }
          else {
            if (ramp._8_4_ != 0x111) {
              uVar2 = uVar8;
              if (ramp._8_4_ == 0x20) {
                uVar2 = uVar8 + 5000;
              }
              goto LAB_00101589;
            }
            local_444 = local_444 + 0.2;
          }
          SDL_SetGamma();
          uVar2 = uVar8;
        }
      }
      else {
        uVar2 = uVar8;
        if ((ramp._0_4_ & 0xff) == 0xc) {
          uVar2 = 0;
        }
      }
      goto LAB_00101589;
    }
  }
  pFVar9 = _stderr;
  uVar6 = SDL_GetError();
  fprintf(pFVar9,"Unable to set gamma: %s\n",uVar6);
  quit((int)pFVar9);
  return extraout_EAX;
}

Assistant:

int main(int argc, char *argv[])
{
	SDL_Surface *screen;
	SDL_Surface *image;
	float gamma;
	int i;
	int w, h, bpp;
	Uint32 flags;
	Uint16 ramp[256];
	Uint16 red_ramp[256];
	Uint32 then, timeout;

	/* Check command line arguments */
	argv += get_video_args(argv, &w, &h, &bpp, &flags);

	/* Initialize SDL */
	if ( SDL_Init(SDL_INIT_VIDEO) < 0 ) {
		fprintf(stderr,
			"Couldn't initialize SDL: %s\n", SDL_GetError());
		return(1);
	}

	/* Initialize the display, always use hardware palette */
	screen = SDL_SetVideoMode(w, h, bpp, flags | SDL_HWPALETTE);
	if ( screen == NULL ) {
		fprintf(stderr, "Couldn't set %dx%d video mode: %s\n",
						w, h, SDL_GetError());
		quit(1);
	}

	/* Set the window manager title bar */
	SDL_WM_SetCaption("SDL gamma test", "testgamma");

	/* Set the desired gamma, if any */
	gamma = 1.0f;
	if ( *argv ) {
		gamma = (float)atof(*argv);
	}
	if ( SDL_SetGamma(gamma, gamma, gamma) < 0 ) {
		fprintf(stderr, "Unable to set gamma: %s\n", SDL_GetError());
		quit(1);
	}

#if 0 /* This isn't supported.  Integrating the gamma ramps isn't exact */
	/* See what gamma was actually set */
	float real[3];
	if ( SDL_GetGamma(&real[0], &real[1], &real[2]) < 0 ) {
		printf("Couldn't get gamma: %s\n", SDL_GetError());
	} else {
		printf("Set gamma values: R=%2.2f, G=%2.2f, B=%2.2f\n",
			real[0], real[1], real[2]);
	}
#endif

	/* Do all the drawing work */
	image = SDL_LoadBMP("sample.bmp");
	if ( image ) {
		SDL_Rect dst;

		dst.x = (screen->w - image->w)/2;
		dst.y = (screen->h - image->h)/2;
		dst.w = image->w;
		dst.h = image->h;
		SDL_BlitSurface(image, NULL, screen, &dst);
		SDL_UpdateRects(screen, 1, &dst);
	}

	/* Wait a bit, handling events */
	then = SDL_GetTicks();
	timeout = (5*1000);
	while ( (SDL_GetTicks()-then) < timeout ) {
		SDL_Event event;

		while ( SDL_PollEvent(&event) ) {
			switch (event.type) {
			    case SDL_QUIT:	/* Quit now */
				timeout = 0;
				break;
			    case SDL_KEYDOWN:
				switch (event.key.keysym.sym) {
				    case SDLK_SPACE:	/* Go longer.. */
					timeout += (5*1000);
					break;
				    case SDLK_UP:
					gamma += 0.2f;
					SDL_SetGamma(gamma, gamma, gamma);
					break;
				    case SDLK_DOWN:
					gamma -= 0.2f;
					SDL_SetGamma(gamma, gamma, gamma);
					break;
				    case SDLK_ESCAPE:
					timeout = 0;
					break;
				    default:
					break;
				}
				break;
			}
		}
	}

	/* Perform a gamma flash to red using color ramps */
	while ( gamma < 10.0 ) {
		/* Increase the red gamma and decrease everything else... */
		gamma += 0.1f;
		CalculateGamma(gamma, red_ramp);
		CalculateGamma(1.0/gamma, ramp);
		SDL_SetGammaRamp(red_ramp, ramp, ramp);
	}
	/* Finish completely red */
	memset(red_ramp, 255, sizeof(red_ramp));
	memset(ramp, 0, sizeof(ramp));
	SDL_SetGammaRamp(red_ramp, ramp, ramp);

	/* Now fade out to black */
	for ( i=(red_ramp[0] >> 8); i >= 0; --i ) {
		memset(red_ramp, i, sizeof(red_ramp));
		SDL_SetGammaRamp(red_ramp, NULL, NULL);
	}
	SDL_Delay(1*1000);

	SDL_Quit();
	return(0);
}